

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall
program_options::error_with_option_name::replace_token
          (error_with_option_name *this,string *from,string *to)

{
  ulong uVar1;
  string *psVar2;
  long in_RDI;
  size_t pos;
  
  while( true ) {
    uVar1 = std::__cxx11::string::c_str();
    std::__cxx11::string::length();
    uVar1 = std::__cxx11::string::find((char *)(in_RDI + 0x98),uVar1,0);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace(in_RDI + 0x98,uVar1,psVar2);
  }
  return;
}

Assistant:

void error_with_option_name::replace_token(const std::string& from, const std::string& to) const
{
    for (;;)
    {
        std::size_t pos = m_message.find(from.c_str(), 0, from.length());
        // not found: all replaced
        if (pos == std::string::npos)
            return;
        m_message.replace(pos, from.length(), to);
    }
}